

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_parse_skip_parens_token(JSParseState *s,int *pbits,BOOL no_line_terminator)

{
  JSToken *token;
  int iVar1;
  BOOL BVar2;
  uint8_t *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  char state [256];
  undefined8 local_140;
  char local_138 [264];
  
  local_138[0] = '\0';
  iVar6 = s->last_line_num;
  iVar1 = (s->token).line_num;
  puVar3 = (s->token).ptr;
  BVar2 = s->got_lf;
  token = &s->token;
  iVar5 = 0;
  uVar9 = 1;
  uVar8 = 0;
  local_140 = (uint *)pbits;
  do {
    iVar4 = token->val;
    if (iVar4 < 0x3b) {
      if (iVar4 < -0x56) {
        if (iVar4 == -0x7e) {
LAB_0015838b:
          if ((s->token).u.str.sep != 0x60) {
            if (0xff < uVar9) goto LAB_0015841f;
            local_138[uVar9] = '`';
LAB_00158318:
            uVar9 = uVar9 + 1;
          }
        }
        else {
          lVar7 = -2;
          if (iVar4 == -0x7a) {
LAB_001582cf:
            if (iVar5 < 0x29) {
              if ((0x32 < iVar5 + 0x80U) ||
                 ((0x438000030001bU >> ((ulong)(iVar5 + 0x80U) & 0x3f) & 1) == 0)) {
LAB_00158405:
                s->buf_ptr = s->buf_ptr + lVar7;
                iVar5 = js_parse_regexp(s);
                if (iVar5 != 0) goto LAB_0015841f;
              }
            }
            else if (((iVar5 != 0x29) && (iVar5 != 0x5d)) && (iVar5 != 0x7d)) goto LAB_00158405;
          }
          else if ((iVar4 == -0x5b) && (uVar9 == 2)) {
            uVar8 = uVar8 | 2;
          }
        }
      }
      else if (iVar4 < 0x29) {
        if (iVar4 == 0x28) goto LAB_00158306;
        if (iVar4 == -0x56) {
          uVar10 = 0xffffffaa;
          goto LAB_00158459;
        }
      }
      else {
        if (iVar4 == 0x29) {
          if (local_138[uVar9 - 1] == '(') goto LAB_001583b1;
          goto LAB_0015841f;
        }
        if (iVar4 == 0x2f) {
          lVar7 = -1;
          goto LAB_001582cf;
        }
      }
    }
    else {
      if (iVar4 < 0x5d) {
        if (iVar4 == 0x3b) {
          uVar8 = uVar8 | uVar9 == 2;
        }
        else if (iVar4 == 0x3d) {
          uVar8 = uVar8 | 4;
        }
        else if (iVar4 == 0x5b) {
LAB_00158306:
          if (uVar9 < 0x100) {
            local_138[uVar9] = (char)iVar4;
            goto LAB_00158318;
          }
          goto LAB_0015841f;
        }
        goto LAB_001583b4;
      }
      if (iVar4 == 0x5d) {
        if (local_138[uVar9 - 1] == '[') {
LAB_001583b1:
          uVar9 = uVar9 - 1;
          goto LAB_001583b4;
        }
LAB_0015841f:
        uVar10 = 0xffffffaa;
        goto LAB_00158459;
      }
      if (iVar4 != 0x7d) {
        if (iVar4 == 0x7b) goto LAB_00158306;
        goto LAB_001583b4;
      }
      lVar7 = uVar9 - 1;
      uVar9 = uVar9 - 1;
      if (local_138[lVar7] != '{') {
        uVar10 = 0xffffffaa;
        if (local_138[lVar7] == '`') {
          free_token(s,token);
          s->got_lf = 0;
          s->last_line_num = (s->token).line_num;
          iVar5 = js_parse_template_part(s,s->buf_ptr);
          if (iVar5 == 0) goto LAB_0015838b;
        }
        goto LAB_00158459;
      }
    }
LAB_001583b4:
    iVar5 = token->val;
    if ((iVar5 == -0x7d) &&
       ((((s->token).u.ident.atom == 0x43 && ((s->token).u.ident.has_escape == 0)) ||
        (((s->token).u.ident.atom == 0x2d && ((s->token).u.ident.has_escape == 0)))))) {
      iVar5 = -0x27;
    }
    iVar4 = next_token(s);
    if (iVar4 != 0) goto LAB_0015841f;
  } while (1 < uVar9);
  uVar10 = token->val;
  if (((uVar10 == 0xffffff83) && ((s->token).u.ident.atom == 0x43)) &&
     ((s->token).u.ident.has_escape == 0)) {
    uVar10 = 0xffffffd9;
  }
  if ((no_line_terminator != 0) && (s->last_line_num != (s->token).line_num)) {
    uVar10 = 10;
  }
LAB_00158459:
  if (local_140 != (uint *)0x0) {
    *local_140 = uVar8;
  }
  (s->token).line_num = iVar6;
  s->line_num = iVar1;
  s->buf_ptr = puVar3;
  s->got_lf = BVar2;
  iVar6 = next_token(s);
  return -(uint)(iVar6 != 0) | uVar10;
}

Assistant:

static int js_parse_skip_parens_token(JSParseState *s, int *pbits, BOOL no_line_terminator)
{
    char state[256];
    size_t level = 0;
    JSParsePos pos;
    int last_tok, tok = TOK_EOF;
    int c, tok_len, bits = 0;

    /* protect from underflow */
    state[level++] = 0;

    js_parse_get_pos(s, &pos);
    last_tok = 0;
    for (;;) {
        switch(s->token.val) {
        case '(':
        case '[':
        case '{':
            if (level >= sizeof(state))
                goto done;
            state[level++] = s->token.val;
            break;
        case ')':
            if (state[--level] != '(')
                goto done;
            break;
        case ']':
            if (state[--level] != '[')
                goto done;
            break;
        case '}':
            c = state[--level];
            if (c == '`') {
                /* continue the parsing of the template */
                free_token(s, &s->token);
                /* Resume TOK_TEMPLATE parsing (s->token.line_num and
                 * s->token.ptr are OK) */
                s->got_lf = FALSE;
                s->last_line_num = s->token.line_num;
                if (js_parse_template_part(s, s->buf_ptr))
                    goto done;
                goto handle_template;
            } else if (c != '{') {
                goto done;
            }
            break;
        case TOK_TEMPLATE:
        handle_template:
            if (s->token.u.str.sep != '`') {
                /* '${' inside the template : closing '}' and continue
                   parsing the template */
                if (level >= sizeof(state))
                    goto done;
                state[level++] = '`';
            } 
            break;
        case TOK_EOF:
            goto done;
        case ';':
            if (level == 2) {
                bits |= SKIP_HAS_SEMI;
            }
            break;
        case TOK_ELLIPSIS:
            if (level == 2) {
                bits |= SKIP_HAS_ELLIPSIS;
            }
            break;
        case '=':
            bits |= SKIP_HAS_ASSIGNMENT;
            break;
            
        case TOK_DIV_ASSIGN:
            tok_len = 2;
            goto parse_regexp;
        case '/':
            tok_len = 1;
        parse_regexp:
            if (is_regexp_allowed(last_tok)) {
                s->buf_ptr -= tok_len;
                if (js_parse_regexp(s)) {
                    /* XXX: should clear the exception */
                    goto done;
                }
            }
            break;
        }
        /* last_tok is only used to recognize regexps */
        if (s->token.val == TOK_IDENT &&
            (token_is_pseudo_keyword(s, JS_ATOM_of) ||
             token_is_pseudo_keyword(s, JS_ATOM_yield))) {
            last_tok = TOK_OF;
        } else {
            last_tok = s->token.val;
        }
        if (next_token(s)) {
            /* XXX: should clear the exception generated by next_token() */
            break;
        }
        if (level <= 1) {
            tok = s->token.val;
            if (token_is_pseudo_keyword(s, JS_ATOM_of))
                tok = TOK_OF;
            if (no_line_terminator && s->last_line_num != s->token.line_num)
                tok = '\n';
            break;
        }
    }
 done:
    if (pbits) {
        *pbits = bits;
    }
    if (js_parse_seek_token(s, &pos))
        return -1;
    return tok;
}